

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PushPolicyBarrier(cmMakefile *this)

{
  unsigned_long local_8;
  
  local_8 = ((long)(this->PolicyStack).
                   super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->PolicyStack).
                  super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->PolicyBarriers,&local_8);
  return;
}

Assistant:

void cmMakefile::PushPolicyBarrier()
{
  this->PolicyBarriers.push_back(this->PolicyStack.size());
}